

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_api.cpp
# Opt level: O2

void parallel_query_with_new_connection(DuckDB *db,bool *correct,size_t threadnr)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  initializer_list<duckdb::Value> __l;
  allocator local_189;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_188;
  bool *local_180;
  size_t local_178;
  DuckDB *local_170;
  templated_unique_single_t conn;
  LogicalType local_160 [24];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_148;
  string local_130 [64];
  Value local_f0 [64];
  Value local_b0 [64];
  Value local_70 [64];
  
  correct[threadnr] = true;
  local_180 = correct;
  local_178 = threadnr;
  local_170 = db;
  for (lVar3 = 0; lVar3 != 100; lVar3 = lVar3 + 1) {
    duckdb::make_uniq<duckdb::Connection,duckdb::DuckDB&>((duckdb *)&conn,local_170);
    duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
    operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               &conn);
    std::__cxx11::string::string(local_130,"SELECT * FROM integers ORDER BY i",&local_189);
    duckdb::Connection::Query((string *)&local_188);
    std::__cxx11::string::~string(local_130);
    duckdb::Value::Value((Value *)local_130,1);
    duckdb::Value::Value(local_f0,2);
    duckdb::Value::Value(local_b0,3);
    duckdb::LogicalType::LogicalType(local_160,SQLNULL);
    duckdb::Value::Value(local_70,local_160);
    __l._M_len = 4;
    __l._M_array = (iterator)local_130;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              (&local_148,__l,(allocator_type *)&local_189);
    bVar1 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                        *)&local_188,0,(vector<duckdb::Value,_true> *)&local_148);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_148);
    lVar2 = 0xc0;
    do {
      duckdb::Value::~Value((Value *)(local_130 + lVar2));
      lVar2 = lVar2 + -0x40;
    } while (lVar2 != -0x40);
    duckdb::LogicalType::~LogicalType(local_160);
    if (!bVar1) {
      local_180[local_178] = false;
    }
    if (local_188._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
    std::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_>::~unique_ptr
              ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>_> *)&conn);
  }
  return;
}

Assistant:

static void parallel_query_with_new_connection(DuckDB *db, bool *correct, size_t threadnr) {
	correct[threadnr] = true;
	for (size_t i = 0; i < 100; i++) {
		auto conn = make_uniq<Connection>(*db);
		auto result = conn->Query("SELECT * FROM integers ORDER BY i");
		if (!CHECK_COLUMN(result, 0, {1, 2, 3, Value()})) {
			correct[threadnr] = false;
		}
	}
}